

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell::createTest
          (TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x25d);
  TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_Test::
  TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_Test
            ((TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, MatchingReturnValueOnWhileSignature)
{
    mock().expectOneCall("foo").withParameter("p1", 1).andReturnValue(1);
    mock().expectOneCall("foo").withParameter("p1", 2).andReturnValue(2);
    mock().expectOneCall("foo").withParameter("p1", 3).andReturnValue(3);
    mock().expectOneCall("foo").ignoreOtherParameters().andReturnValue(4);

    LONGS_EQUAL(3, mock().actualCall("foo").withParameter("p1", 3).returnValue().getIntValue());
    LONGS_EQUAL(4, mock().actualCall("foo").withParameter("p1", 4).returnValue().getIntValue());
    LONGS_EQUAL(1, mock().actualCall("foo").withParameter("p1", 1).returnValue().getIntValue());
    LONGS_EQUAL(2, mock().actualCall("foo").withParameter("p1", 2).returnValue().getIntValue());
}